

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O2

__pid_t __thiscall bsplib::Unbuf::wait(Unbuf *this,void *__stat_loc)

{
  pointer ppoVar1;
  pointer pEVar2;
  char *pcVar3;
  pointer piVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int i;
  long lVar9;
  int outcount;
  int local_2c;
  
  while( true ) {
    local_2c = -0x7ffe;
    ppoVar1 = (this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    MPI_Waitsome((ulong)((long)(this->m_reqs).
                               super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppoVar1) >> 3,
                 ppoVar1,&local_2c,
                 (this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,0);
    if (local_2c == -0x7ffe) break;
    for (lVar9 = 0; lVar9 < local_2c; lVar9 = lVar9 + 1) {
      uVar5 = (ulong)(this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9];
      pEVar2 = (this->m_recvs).
               super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar7 = (long)(this->m_recvs).
                    super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pEVar2 >> 5;
      lVar6 = uVar5 - uVar7;
      if (uVar5 < uVar7) {
        pcVar3 = pEVar2[uVar5].addr;
        uVar7 = pEVar2[uVar5].size;
        uVar8 = this->m_max_msg_size;
        if (uVar7 < this->m_max_msg_size) {
          uVar8 = uVar7;
        }
        pEVar2[uVar5].addr = pcVar3 + uVar8;
        pEVar2[uVar5].size = uVar7 - uVar8;
        if (uVar8 != 0) {
          MPI_Irecv(pcVar3,uVar8,&ompi_mpi_byte,pEVar2[uVar5].pid,pEVar2[uVar5].tag,this->m_comm,
                    (this->m_reqs).
                    super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar5);
        }
      }
      else {
        pEVar2 = (this->m_sends).
                 super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar3 = pEVar2[lVar6].addr;
        uVar7 = pEVar2[lVar6].size;
        uVar8 = this->m_max_msg_size;
        if (uVar7 < this->m_max_msg_size) {
          uVar8 = uVar7;
        }
        pEVar2[lVar6].addr = pcVar3 + uVar8;
        pEVar2[lVar6].size = uVar7 - uVar8;
        if (uVar8 != 0) {
          MPI_Isend(pcVar3,uVar8,&ompi_mpi_byte,pEVar2[lVar6].pid,pEVar2[lVar6].tag,this->m_comm,
                    (this->m_reqs).
                    super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar5);
        }
      }
    }
  }
  pEVar2 = (this->m_sends).
           super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_sends).
      super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar2) {
    (this->m_sends).super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
    _M_impl.super__Vector_impl_data._M_finish = pEVar2;
  }
  pEVar2 = (this->m_recvs).
           super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_recvs).
      super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar2) {
    (this->m_recvs).super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
    _M_impl.super__Vector_impl_data._M_finish = pEVar2;
  }
  ppoVar1 = (this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppoVar1) {
    (this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppoVar1;
  }
  piVar4 = (this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar4) {
    (this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
  }
  return (__pid_t)piVar4;
}

Assistant:

void Unbuf :: wait( ) 
{
    while (true)
    {
        int outcount = MPI_UNDEFINED;
        MPI_Waitsome( int(m_reqs.size()), m_reqs.data(), &outcount, 
                m_ready.data(), MPI_STATUSES_IGNORE );
    
        if (outcount == MPI_UNDEFINED )
            break;

        for (int i = 0; i < outcount; ++i ) {
            size_t r = m_ready[i];

            if (r < m_recvs.size()) {
               Entry & u = m_recvs[r];
               size_t size = std::min( m_max_msg_size, u.size );
               char * addr = const_cast<char *>( u.addr );
               char * next_addr = addr + size;
               u.addr = next_addr;
               u.size -= size;
               const int tag = u.tag;
               
               if (size > 0) 
                MPI_Irecv( addr, int(size), MPI_BYTE, 
                           u.pid, tag, m_comm, &m_reqs[r]);
            }
            else
            {
               Entry & u = m_sends[r - m_recvs.size()];
               size_t size = std::min( m_max_msg_size, u.size );
               char * addr = const_cast<char *>( u.addr );
               char * next_addr = addr  + size;
               u.addr = next_addr;
               u.size -= size;
               const int tag = u.tag;

               if (size > 0)
                MPI_Isend(addr, int(size), MPI_BYTE, 
                          u.pid, tag, m_comm, &m_reqs[r]);
            }
        }
    }

    m_sends.clear();
    m_recvs.clear();
    m_reqs.clear();
    m_ready.clear();
}